

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshTopology::TopVertexIsHidden(ON_MeshTopology *this,int topvi)

{
  int iVar1;
  ON_MeshTopologyVertex *pOVar2;
  bool *local_48;
  int local_34;
  int i;
  ON_MeshTopologyVertex *topv;
  bool *bHiddenVertex;
  int topvi_local;
  ON_MeshTopology *this_local;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    local_48 = (bool *)0x0;
  }
  else {
    local_48 = ON_Mesh::HiddenVertexArray(this->m_mesh);
  }
  if (((local_48 != (bool *)0x0) && (-1 < topvi)) &&
     (iVar1 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv), topvi < iVar1)) {
    pOVar2 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,topvi);
    local_34 = 0;
    while( true ) {
      if (pOVar2->m_v_count <= local_34) {
        return true;
      }
      if ((local_48[pOVar2->m_vi[local_34]] & 1U) == 0) break;
      local_34 = local_34 + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool ON_MeshTopology::TopVertexIsHidden( int topvi ) const
{
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topvi >= 0 && topvi < m_topv.Count() )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    int i;
    for ( i = 0; i < topv.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv.m_vi[i]] )
        return false;
    }
    return true;
  }
  return false;
}